

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_DimStyle * Internal_DimStyleInchFractional(void)

{
  ON_UUID id_00;
  ON_DimStyle *in_RDI;
  ON_UUID id;
  ON_DimStyle *dimstyle;
  
  ON_DimStyle::ON_DimStyle(in_RDI);
  id_00.Data4[0] = 0xa1;
  id_00.Data4[1] = '\"';
  id_00.Data4[2] = 'O';
  id_00.Data4[3] = 199;
  id_00.Data4[4] = 'x';
  id_00.Data4[5] = '+';
  id_00.Data4[6] = 0xc4;
  id_00.Data4[7] = 0x86;
  id_00.Data1 = 0x6bcb1506;
  id_00.Data2 = 0x699f;
  id_00.Data3 = 0x445d;
  Internal_DimStyleInit(L"Inch Fractional",-3,id_00,in_RDI);
  Internal_DimStyleInchFractionalInit(in_RDI);
  Internal_SystemDimStyleFinalize(in_RDI);
  return in_RDI;
}

Assistant:

static ON_DimStyle Internal_DimStyleInchFractional()
{
  const ON_UUID id =
  { 0x6bcb1506, 0x699f, 0x445d,{ 0xa1, 0x22, 0x4f, 0xc7, 0x78, 0x2b, 0xc4, 0x86 } };

  ON_DimStyle dimstyle;
  Internal_DimStyleInit(L"Inch Fractional", -3, id, dimstyle);
  Internal_DimStyleInchFractionalInit(dimstyle);
  Internal_SystemDimStyleFinalize(dimstyle);
  return dimstyle;
}